

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_globals.cpp
# Opt level: O0

void __thiscall
megumax::SearchGlobals::SearchGlobals
          (SearchGlobals *this,uint64_t nodes,
          optional<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> start_time,
          optional<libchess::UCIGoParameters> *go_parameters)

{
  undefined1 in_CL;
  undefined8 in_RDX;
  optional<libchess::UCIGoParameters> *in_RDI;
  optional<libchess::UCIGoParameters> *in_R8;
  undefined7 uStack_7;
  
  memset(in_RDI,0,0x28);
  std::mutex::mutex((mutex *)0x123e12);
  std::condition_variable::condition_variable
            ((condition_variable *)
             &(in_RDI->super__Optional_base<libchess::UCIGoParameters,_false,_false>)._M_payload.
              super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
              super__Optional_payload_base<libchess::UCIGoParameters>._M_payload._M_value.winc_);
  *(undefined4 *)
   ((long)&(in_RDI->super__Optional_base<libchess::UCIGoParameters,_false,_false>)._M_payload.
           super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
           super__Optional_payload_base<libchess::UCIGoParameters>._M_payload + 0x58) = 0;
  std::atomic<bool>::atomic((atomic<bool> *)in_RDI,SUB81((ulong)in_R8 >> 0x38,0));
  std::atomic<bool>::atomic((atomic<bool> *)in_RDI,SUB81((ulong)in_R8 >> 0x38,0));
  std::atomic<unsigned_long>::atomic((atomic<unsigned_long> *)in_RDI,(__integral_type)in_R8);
  *(undefined8 *)
   ((long)&(in_RDI->super__Optional_base<libchess::UCIGoParameters,_false,_false>)._M_payload.
           super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
           super__Optional_payload_base<libchess::UCIGoParameters>._M_payload + 0x68) = in_RDX;
  *(ulong *)&(in_RDI->super__Optional_base<libchess::UCIGoParameters,_false,_false>)._M_payload.
             super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
             super__Optional_payload_base<libchess::UCIGoParameters>._M_engaged =
       CONCAT71(uStack_7,in_CL);
  std::optional<libchess::UCIGoParameters>::optional(in_RDI,in_R8);
  *(undefined1 *)
   &in_RDI[2].super__Optional_base<libchess::UCIGoParameters,_false,_false>._M_payload.
    super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
    super__Optional_payload_base<libchess::UCIGoParameters>._M_payload = 0;
  return;
}

Assistant:

SearchGlobals::SearchGlobals(std::uint64_t nodes,
                             std::optional<std::chrono::milliseconds> start_time,
                             std::optional<libchess::UCIGoParameters> go_parameters) noexcept
    : debug_mutex(),
      debug_cv(),
      side_to_move_(libchess::constants::WHITE),
      searching_(false),
      stop_flag_(false),
      nodes_(nodes),
      start_time_(start_time),
      go_parameters_(std::move(go_parameters)),
      debug_(false) {
}